

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void refresh_fc_eg_slot(FM_OPN *OPN,FM_SLOT *SLOT,int fc,int kc)

{
  uint uVar1;
  int local_1c;
  int kc_local;
  int fc_local;
  FM_SLOT *SLOT_local;
  FM_OPN *OPN_local;
  
  local_1c = SLOT->DT[kc] + fc;
  if (local_1c < 0) {
    local_1c = OPN->fn_max + local_1c;
  }
  SLOT->Incr = local_1c * SLOT->mul >> 1;
  uVar1 = kc >> (SLOT->KSR & 0x1f);
  if (SLOT->ksr != uVar1) {
    SLOT->ksr = (UINT8)uVar1;
    if (SLOT->ar + (uint)SLOT->ksr < 0x5e) {
      SLOT->eg_sh_ar =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [SLOT->ar + (uint)SLOT->ksr];
      SLOT->eg_sel_ar = eg_rate_select[SLOT->ar + (uint)SLOT->ksr];
    }
    else {
      SLOT->eg_sh_ar = '\0';
      SLOT->eg_sel_ar = 0x90;
    }
    SLOT->eg_sh_d1r =
         "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
         [SLOT->d1r + (uint)SLOT->ksr];
    SLOT->eg_sel_d1r = eg_rate_select[SLOT->d1r + (uint)SLOT->ksr];
    SLOT->eg_sh_d2r =
         "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
         [SLOT->d2r + (uint)SLOT->ksr];
    SLOT->eg_sel_d2r = eg_rate_select[SLOT->d2r + (uint)SLOT->ksr];
    SLOT->eg_sh_rr =
         "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
         [SLOT->rr + (uint)SLOT->ksr];
    SLOT->eg_sel_rr = eg_rate_select[SLOT->rr + (uint)SLOT->ksr];
  }
  return;
}

Assistant:

INLINE void refresh_fc_eg_slot(FM_OPN *OPN, FM_SLOT *SLOT , int fc , int kc )
{
	/* add detune value */
	fc += SLOT->DT[kc];

	/* detects frequency overflow (credits to Nemesis) */
	if (fc < 0) fc += OPN->fn_max;

	/* (frequency) phase increment counter */
	SLOT->Incr = (fc * SLOT->mul) >> 1;

	/* ksr */
	kc = kc >> SLOT->KSR;

	if( SLOT->ksr != kc )
	{
		SLOT->ksr = kc;

		/* recalculate envelope generator rates */
		if ((SLOT->ar + SLOT->ksr) < (32+62))
		{
			SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar  + SLOT->ksr ];
			SLOT->eg_sel_ar = eg_rate_select[SLOT->ar  + SLOT->ksr ];
		}
		else
		{
			/* verified by Nemesis on real hardware (Attack phase is blocked) */
			SLOT->eg_sh_ar  = 0;
			SLOT->eg_sel_ar = 18*RATE_STEPS;
		}

		SLOT->eg_sh_d1r = eg_rate_shift [SLOT->d1r + SLOT->ksr];
		SLOT->eg_sel_d1r= eg_rate_select[SLOT->d1r + SLOT->ksr];

		SLOT->eg_sh_d2r = eg_rate_shift [SLOT->d2r + SLOT->ksr];
		SLOT->eg_sel_d2r= eg_rate_select[SLOT->d2r + SLOT->ksr];

		SLOT->eg_sh_rr  = eg_rate_shift [SLOT->rr  + SLOT->ksr];
		SLOT->eg_sel_rr = eg_rate_select[SLOT->rr  + SLOT->ksr];

	}
}